

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_ports_linux.cc
# Opt level: O3

string * usb_sysfs_hw_string(string *__return_storage_ptr__,string *sysfs_path)

{
  string *psVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string vid;
  string pid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string serial_number;
  undefined1 local_a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  psVar1 = (string *)(local_a8 + 0x10);
  pcVar2 = (sysfs_path->_M_dataplus)._M_p;
  local_a8._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,pcVar2,pcVar2 + sysfs_path->_M_string_length);
  std::__cxx11::string::append(local_a8);
  read_line((string *)(local_58 + 0x10),(string *)local_a8._0_8_);
  if ((string *)local_a8._0_8_ != psVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  if (local_48._8_8_ != 0) {
    format_abi_cxx11_((string *)local_a8,"SNR=%s",local_48._M_allocated_capacity);
    std::__cxx11::string::operator=((string *)(local_58 + 0x10),(string *)local_a8);
    if ((string *)local_a8._0_8_ != psVar1) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
  }
  pcVar2 = (sysfs_path->_M_dataplus)._M_p;
  local_88._M_allocated_capacity = (size_type)&local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + sysfs_path->_M_string_length);
  std::__cxx11::string::append(local_88._M_local_buf);
  read_line((string *)local_a8,(string *)local_88._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_allocated_capacity != &local_78) {
    operator_delete((void *)local_88._M_allocated_capacity,local_78._M_allocated_capacity + 1);
  }
  pcVar2 = (sysfs_path->_M_dataplus)._M_p;
  local_68._M_allocated_capacity = (size_type)(string *)local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + sysfs_path->_M_string_length);
  std::__cxx11::string::append(local_68._M_local_buf);
  read_line((string *)&local_88,(string *)local_68._M_allocated_capacity);
  if ((string *)local_68._M_allocated_capacity != (string *)local_58) {
    operator_delete((void *)local_68._M_allocated_capacity,(ulong)(local_58._0_8_ + 1));
  }
  format_abi_cxx11_(__return_storage_ptr__,"USB VID:PID=%s:%s %s",local_a8._0_8_,
                    local_88._M_allocated_capacity,local_48._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_allocated_capacity != &local_78) {
    operator_delete((void *)local_88._M_allocated_capacity,local_78._M_allocated_capacity + 1);
  }
  if ((string *)local_a8._0_8_ != psVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  paVar3 = &local_38;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_allocated_capacity != paVar3) {
    operator_delete((void *)local_48._M_allocated_capacity,local_38._M_allocated_capacity + 1);
    paVar3 = extraout_RAX;
  }
  return (string *)paVar3;
}

Assistant:

string
usb_sysfs_hw_string(const string& sysfs_path)
{
    string serial_number = read_line( sysfs_path + "/serial" );

    if( serial_number.length() > 0 )
    {
        serial_number = format( "SNR=%s", serial_number.c_str() );
    }

    string vid = read_line( sysfs_path + "/idVendor" );

    string pid = read_line( sysfs_path + "/idProduct" );

    return format("USB VID:PID=%s:%s %s", vid.c_str(), pid.c_str(), serial_number.c_str() );
}